

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void __thiscall
el::base::Storage::installCustomFormatSpecifier
          (Storage *this,CustomFormatSpecifier *customFormatSpecifier)

{
  bool bVar1;
  
  bVar1 = hasCustomFormatSpecifier(this,customFormatSpecifier->m_formatSpecifier);
  if (bVar1) {
    return;
  }
  (*(this->super_ThreadSafe)._vptr_ThreadSafe[2])(this);
  utils::std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>::
  push_back(&this->m_customFormatSpecifiers,customFormatSpecifier);
  return;
}

Assistant:

void Storage::installCustomFormatSpecifier(const CustomFormatSpecifier& customFormatSpecifier) {
  if (hasCustomFormatSpecifier(customFormatSpecifier.formatSpecifier())) {
    return;
  }
  base::threading::ScopedLock scopedLock(lock());
  m_customFormatSpecifiers.push_back(customFormatSpecifier);
}